

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t
ctrl_set_number_spatial_layers(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  AV1_COMP *pAVar2;
  aom_internal_error_info *paVar3;
  bool bVar4;
  aom_codec_err_t aVar5;
  aom_codec_err_t extraout_EAX;
  int iVar6;
  uint *puVar7;
  AV1EncoderConfig *oxcf;
  AV1_PRIMARY *pAVar8;
  long lVar9;
  _Bool _Stack_41;
  aom_codec_alg_priv_t_conflict *paStack_40;
  AV1EncoderConfig *pAStack_38;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar7 = (uint *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar7 = (uint *)args->overflow_arg_area;
    args->overflow_arg_area = puVar7 + 2;
  }
  aVar5 = AOM_CODEC_INVALID_PARAM;
  if ((int)*puVar7 < 5) {
    pAVar8 = ctx->ppi;
    pAVar8->number_spatial_layers = *puVar7;
    aVar5 = AOM_CODEC_OK;
    if (pAVar8->seq_params_locked == 0) {
      oxcf = &ctx->oxcf;
      set_encoder_config(oxcf,&ctx->cfg,&ctx->extra_cfg);
      av1_check_fpmt_config(ctx->ppi,oxcf);
      _Stack_41 = false;
      pAStack_38 = oxcf;
      av1_change_config_seq(ctx->ppi,oxcf,&_Stack_41);
      pAVar8 = ctx->ppi;
      bVar4 = 0 < pAVar8->num_fp_contexts;
      aVar5 = extraout_EAX;
      paStack_40 = ctx;
      if (0 < pAVar8->num_fp_contexts) {
        lVar9 = 0;
        do {
          pAVar2 = pAVar8->parallel_cpi[lVar9];
          paVar3 = (pAVar2->common).error;
          iVar6 = _setjmp((__jmp_buf_tag *)paVar3->jmp);
          if (iVar6 == 0) {
            paVar3->setjmp = 1;
            av1_change_config(pAVar2,pAStack_38,_Stack_41);
            paVar3->setjmp = 0;
            oxcf = (AV1EncoderConfig *)((ulong)oxcf & 0xffffffff);
          }
          else {
            paVar3->setjmp = 0;
            oxcf = (AV1EncoderConfig *)(ulong)paVar3->error_code;
          }
          aVar5 = (aom_codec_err_t)oxcf;
          if (iVar6 != 0) break;
          lVar9 = lVar9 + 1;
          pAVar8 = paStack_40->ppi;
          bVar4 = lVar9 < pAVar8->num_fp_contexts;
        } while (lVar9 < pAVar8->num_fp_contexts);
      }
      if (!bVar4) {
        pAVar2 = paStack_40->ppi->cpi_lap;
        if (pAVar2 != (AV1_COMP *)0x0) {
          paVar3 = (pAVar2->common).error;
          iVar6 = _setjmp((__jmp_buf_tag *)paVar3->jmp);
          if (iVar6 != 0) {
            paVar3->setjmp = 0;
            return paVar3->error_code;
          }
          paVar3->setjmp = 1;
          av1_change_config(pAVar2,pAStack_38,_Stack_41);
          paVar3->setjmp = 0;
        }
        aVar5 = AOM_CODEC_OK;
      }
      return aVar5;
    }
  }
  return aVar5;
}

Assistant:

static aom_codec_err_t ctrl_set_number_spatial_layers(aom_codec_alg_priv_t *ctx,
                                                      va_list args) {
  const int number_spatial_layers = va_arg(args, int);
  if (number_spatial_layers > MAX_NUM_SPATIAL_LAYERS)
    return AOM_CODEC_INVALID_PARAM;
  ctx->ppi->number_spatial_layers = number_spatial_layers;
  // update_encoder_cfg() is somewhat costly and this control may be called
  // multiple times, so update_encoder_cfg() is only called to ensure frame and
  // superblock sizes are updated before they're fixed by the first encode
  // call.
  if (!ctx->ppi->seq_params_locked) {
    return update_encoder_cfg(ctx);
  }
  return AOM_CODEC_OK;
}